

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_region.cpp
# Opt level: O0

ON_Brep * __thiscall ON_Brep::SubBrep(ON_Brep *this,int subfi_count,int *subfi,ON_Brep *sub_brep)

{
  ON_3dPoint *pOVar1;
  uchar *puVar2;
  byte bVar3;
  ISO iso;
  undefined4 uVar4;
  ON_BrepTrim *pOVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  ON_BrepFace *__s;
  ON_Brep *pOVar10;
  undefined4 extraout_var;
  ON_BrepVertex *v0;
  ON_BrepVertex *v1;
  ON_BrepEdge *pOVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ON_BrepTrim *vertex_00;
  ON_BrepTrimArray *this_00;
  ON_BoundingBox local_1d8;
  ON_BrepTrim *local_1a8;
  ON_BrepTrim *sub_trim;
  ON_BrepVertex *sub_vertex_2;
  ON_BrepTrim *sub_trim_1;
  ON_BrepVertex *sub_vertex_1;
  ON_BrepEdge *sub_edge_1;
  ON_Curve *c2;
  ON_BrepTrim *trim_1;
  ON_BrepLoop *sub_loop;
  ON_BrepLoop *loop_1;
  ON_BrepFace *sub_face;
  ON_Surface *srf;
  ON_BrepFace *face_1;
  ON_BoundingBox sub_bbox;
  bool bHaveBBox;
  ON_BrepEdge *sub_edge;
  ON_BrepVertex *sub_v1;
  ON_BrepVertex *sub_v0;
  ON_Curve *c3;
  ON_BrepEdge *edge_1;
  double dStack_e0;
  double local_d8;
  ON_BrepVertex *local_d0;
  ON_BrepVertex *sub_vertex;
  ON_BrepVertex *vertex;
  ON_BrepEdge *edge;
  ON_BrepTrim *trim;
  ON_BrepLoop *loop;
  ON_BrepFace *face;
  int *Vmap;
  int *Emap;
  int local_88;
  int minfi;
  int maxfi;
  int Vcount;
  int Ecount;
  int Tcount;
  int Lcount;
  int j;
  int i;
  int lti;
  int fli;
  int fi;
  undefined1 local_50 [8];
  LeakStopper leak_stopper;
  ON_Brep *sub_brep_local;
  int *subfi_local;
  int subfi_count_local;
  ON_Brep *this_local;
  
  leak_stopper.m_sub_brep = sub_brep;
  SubBrep::LeakStopper::LeakStopper((LeakStopper *)local_50);
  if (leak_stopper.m_sub_brep != (ON_Brep *)0x0) {
    Destroy(leak_stopper.m_sub_brep);
  }
  if ((subfi_count < 1) || (subfi == (int *)0x0)) {
    this_local = (ON_Brep *)0x0;
  }
  else {
    iVar7 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
    if (iVar7 < subfi_count) {
      this_local = (ON_Brep *)0x0;
    }
    else {
      Ecount = 0;
      Vcount = 0;
      maxfi = 0;
      minfi = 0;
      local_88 = -1;
      Emap._4_4_ = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
      iVar7 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
      piVar9 = ON_Workspace::GetIntMemory((ON_Workspace *)local_50,(long)iVar7);
      Vmap = piVar9;
      iVar7 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E);
      memset(piVar9,0,(long)iVar7 << 2);
      iVar7 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
      __s = (ON_BrepFace *)ON_Workspace::GetIntMemory((ON_Workspace *)local_50,(long)iVar7);
      face = __s;
      iVar7 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V);
      memset(__s,0,(long)iVar7 << 2);
      for (Lcount = 0; Lcount < subfi_count; Lcount = Lcount + 1) {
        iVar7 = subfi[Lcount];
        lti = iVar7;
        if ((iVar7 < 0) ||
           (iVar8 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F),
           iVar8 <= iVar7)) {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep_region.cpp"
                     ,0x443,"","ON_Brep::SubBrep sub_fi[] has invalid indices");
          this_local = (ON_Brep *)0x0;
          goto LAB_0056640d;
        }
        if (local_88 < lti) {
          local_88 = lti;
        }
        else if (lti < Emap._4_4_) {
          Emap._4_4_ = lti;
        }
        else {
          for (Tcount = 0; Tcount < Lcount; Tcount = Tcount + 1) {
            if (subfi[Tcount] == lti) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep_region.cpp"
                         ,0x450,"","ON_Brep::SubBrep sub_fi[] has duplicate indices");
              this_local = (ON_Brep *)0x0;
              goto LAB_0056640d;
            }
          }
        }
        loop = (ON_BrepLoop *)
               ON_ClassArray<ON_BrepFace>::operator[]((ON_ClassArray<ON_BrepFace> *)&this->m_F,lti);
        for (i = 0; iVar7 = i,
            iVar8 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)&(loop->m_ti).m_count),
            iVar7 < iVar8; i = i + 1) {
          trim = (ON_BrepTrim *)ON_BrepFace::Loop((ON_BrepFace *)loop,i);
          if ((trim == (ON_BrepTrim *)0x0) ||
             (pOVar10 = ON_BrepLoop::Brep((ON_BrepLoop *)trim), this != pOVar10)) {
            this_local = (ON_Brep *)0x0;
            goto LAB_0056640d;
          }
          Ecount = Ecount + 1;
          for (j = 0; iVar7 = j,
              iVar8 = ON_SimpleArray<int>::Count
                                ((ON_SimpleArray<int> *)
                                 &(trim->super_ON_CurveProxy).m_real_curve_domain), iVar7 < iVar8;
              j = j + 1) {
            edge = (ON_BrepEdge *)ON_BrepLoop::Trim((ON_BrepLoop *)trim,j);
            if (((ON_BrepTrim *)edge == (ON_BrepTrim *)0x0) ||
               (pOVar10 = ON_BrepTrim::Brep((ON_BrepTrim *)edge), this != pOVar10)) {
              this_local = (ON_Brep *)0x0;
              goto LAB_0056640d;
            }
            Vcount = Vcount + 1;
            if ((edge->m_vi[1] < 0) ||
               (iVar7 = edge->m_vi[1],
               iVar8 = ON_ClassArray<ON_BrepVertex>::Count
                                 ((ON_ClassArray<ON_BrepVertex> *)&this->m_V), iVar8 <= iVar7)) {
              this_local = (ON_Brep *)0x0;
              goto LAB_0056640d;
            }
            if ((*(int *)&edge->field_0x5c < 0) ||
               (iVar7 = *(int *)&edge->field_0x5c,
               iVar8 = ON_ClassArray<ON_BrepVertex>::Count
                                 ((ON_ClassArray<ON_BrepVertex> *)&this->m_V), iVar8 <= iVar7)) {
              this_local = (ON_Brep *)0x0;
              goto LAB_0056640d;
            }
            if (*(int *)((face->m_face_uuid).Data4 + (long)edge->m_vi[1] * 4 + -0x5c) == 0) {
              puVar2 = (face->m_face_uuid).Data4 + (long)edge->m_vi[1] * 4 + -0x5c;
              puVar2[0] = '\x01';
              puVar2[1] = '\0';
              puVar2[2] = '\0';
              puVar2[3] = '\0';
              minfi = minfi + 1;
            }
            if (*(int *)((face->m_face_uuid).Data4 + (long)*(int *)&edge->field_0x5c * 4 + -0x5c) ==
                0) {
              puVar2 = (face->m_face_uuid).Data4 + (long)*(int *)&edge->field_0x5c * 4 + -0x5c;
              puVar2[0] = '\x01';
              puVar2[1] = '\0';
              puVar2[2] = '\0';
              puVar2[3] = '\0';
              minfi = minfi + 1;
            }
            if ((*(int *)((long)&(edge->m_ti)._vptr_ON_SimpleArray + 4) == 4) ||
               (*(int *)((long)&(edge->m_ti)._vptr_ON_SimpleArray + 4) == 6)) {
              if ((-1 < edge->m_vi[0]) || (edge->m_vi[1] != *(int *)&edge->field_0x5c)) {
                this_local = (ON_Brep *)0x0;
                goto LAB_0056640d;
              }
            }
            else {
              if (edge->m_vi[0] < 0) {
                this_local = (ON_Brep *)0x0;
                goto LAB_0056640d;
              }
              vertex = (ON_BrepVertex *)ON_BrepTrim::Edge((ON_BrepTrim *)edge);
              if (((ON_BrepEdge *)vertex == (ON_BrepEdge *)0x0) ||
                 (pOVar10 = ON_BrepEdge::Brep((ON_BrepEdge *)vertex), this != pOVar10)) {
                this_local = (ON_Brep *)0x0;
                goto LAB_0056640d;
              }
              if (Vmap[edge->m_vi[0]] == 0) {
                Vmap[edge->m_vi[0]] = 1;
                maxfi = maxfi + 1;
                if (*(int *)((face->m_face_uuid).Data4 +
                            (long)*(int *)((long)&vertex->m_tolerance + 4) * 4 + -0x5c) == 0) {
                  this_local = (ON_Brep *)0x0;
                  goto LAB_0056640d;
                }
                if (*(int *)((face->m_face_uuid).Data4 +
                            (long)*(int *)&vertex[1].super_ON_Point.super_ON_Geometry.
                                           super_ON_Object._vptr_ON_Object * 4 + -0x5c) == 0) {
                  this_local = (ON_Brep *)0x0;
                  goto LAB_0056640d;
                }
              }
            }
          }
        }
      }
      if (leak_stopper.m_sub_brep == (ON_Brep *)0x0) {
        leak_stopper.super_ON_Workspace.m_pMemBlk = (ON_Workspace_MBLK *)New();
        leak_stopper.m_sub_brep = (ON_Brep *)leak_stopper.super_ON_Workspace.m_pMemBlk;
      }
      else {
        leak_stopper.m_p = leak_stopper.m_sub_brep;
      }
      ON_ClassArray<ON_BrepFace>::Reserve
                ((ON_ClassArray<ON_BrepFace> *)&(leak_stopper.m_sub_brep)->m_F,(long)subfi_count);
      ON_ClassArray<ON_BrepLoop>::Reserve
                ((ON_ClassArray<ON_BrepLoop> *)&(leak_stopper.m_sub_brep)->m_L,(long)Ecount);
      ON_ClassArray<ON_BrepTrim>::Reserve
                ((ON_ClassArray<ON_BrepTrim> *)&(leak_stopper.m_sub_brep)->m_T,(long)Vcount);
      ON_ClassArray<ON_BrepEdge>::Reserve
                ((ON_ClassArray<ON_BrepEdge> *)&(leak_stopper.m_sub_brep)->m_E,(long)maxfi);
      ON_ClassArray<ON_BrepVertex>::Reserve
                ((ON_ClassArray<ON_BrepVertex> *)&(leak_stopper.m_sub_brep)->m_V,(long)minfi);
      ON_SimpleArray<ON_Surface_*>::Reserve
                (&((leak_stopper.m_sub_brep)->m_S).super_ON_SimpleArray<ON_Surface_*>,
                 (long)subfi_count);
      ON_SimpleArray<ON_Curve_*>::Reserve
                (&((leak_stopper.m_sub_brep)->m_C2).super_ON_SimpleArray<ON_Curve_*>,(long)Vcount);
      ON_SimpleArray<ON_Curve_*>::Reserve
                (&((leak_stopper.m_sub_brep)->m_C3).super_ON_SimpleArray<ON_Curve_*>,(long)maxfi);
      for (Lcount = 0; iVar7 = Lcount,
          iVar8 = ON_ClassArray<ON_BrepVertex>::Count((ON_ClassArray<ON_BrepVertex> *)&this->m_V),
          iVar7 < iVar8; Lcount = Lcount + 1) {
        if (*(int *)((face->m_face_uuid).Data4 + (long)Lcount * 4 + -0x5c) == 0) {
          puVar2 = (face->m_face_uuid).Data4 + (long)Lcount * 4 + -0x5c;
          puVar2[0] = 0xff;
          puVar2[1] = 0xff;
          puVar2[2] = 0xff;
          puVar2[3] = 0xff;
        }
        else {
          sub_vertex = ON_ClassArray<ON_BrepVertex>::operator[]
                                 ((ON_ClassArray<ON_BrepVertex> *)&this->m_V,Lcount);
          local_d8 = (sub_vertex->super_ON_Point).point.z;
          pOVar1 = &(sub_vertex->super_ON_Point).point;
          edge_1 = (ON_BrepEdge *)pOVar1->x;
          dStack_e0 = (sub_vertex->super_ON_Point).point.y;
          local_d0 = NewVertex(leak_stopper.m_sub_brep,*pOVar1,sub_vertex->m_tolerance);
          *(int *)((face->m_face_uuid).Data4 + (long)Lcount * 4 + -0x5c) = local_d0->m_vertex_index;
          ON_Object::CopyUserData((ON_Object *)local_d0,(ON_Object *)sub_vertex);
          local_d0->m_vertex_user = sub_vertex->m_vertex_user;
        }
      }
      for (Lcount = 0; iVar7 = Lcount,
          iVar8 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E),
          iVar7 < iVar8; Lcount = Lcount + 1) {
        if (Vmap[Lcount] == 0) {
          Vmap[Lcount] = -1;
        }
        else {
          c3 = (ON_Curve *)
               ON_ClassArray<ON_BrepEdge>::operator[]
                         ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,Lcount);
          if (*(int *)((face->m_face_uuid).Data4 + (long)((ON_BrepEdge *)c3)->m_vi[0] * 4 + -0x5c) <
              0) {
            this_local = (ON_Brep *)0x0;
            goto LAB_0056640d;
          }
          if (*(int *)((face->m_face_uuid).Data4 + (long)((ON_BrepEdge *)c3)->m_vi[1] * 4 + -0x5c) <
              0) {
            this_local = (ON_Brep *)0x0;
            goto LAB_0056640d;
          }
          iVar7 = (*(((ON_BrepEdge *)c3)->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.
                    super_ON_Object._vptr_ON_Object[0x24])();
          sub_v0 = (ON_BrepVertex *)CONCAT44(extraout_var,iVar7);
          if (sub_v0 == (ON_BrepVertex *)0x0) {
            this_local = (ON_Brep *)0x0;
            goto LAB_0056640d;
          }
          ON_SimpleArray<ON_Curve_*>::Append
                    (&((leak_stopper.m_sub_brep)->m_C3).super_ON_SimpleArray<ON_Curve_*>,
                     (ON_Curve **)&sub_v0);
          v0 = ON_ClassArray<ON_BrepVertex>::operator[]
                         ((ON_ClassArray<ON_BrepVertex> *)&(leak_stopper.m_sub_brep)->m_V,
                          *(int *)((face->m_face_uuid).Data4 +
                                  (long)*(int *)((long)&c3[5].super_ON_Geometry.super_ON_Object.
                                                        _vptr_ON_Object + 4) * 4 + -0x5c));
          v1 = ON_ClassArray<ON_BrepVertex>::operator[]
                         ((ON_ClassArray<ON_BrepVertex> *)&(leak_stopper.m_sub_brep)->m_V,
                          *(int *)((face->m_face_uuid).Data4 +
                                  (long)*(int *)&c3[5].super_ON_Geometry.super_ON_Object.
                                                 m_userdata_list * 4 + -0x5c));
          pOVar10 = leak_stopper.m_sub_brep;
          iVar7 = ON_SimpleArray<ON_Curve_*>::Count
                            (&((leak_stopper.m_sub_brep)->m_C3).super_ON_SimpleArray<ON_Curve_*>);
          pOVar11 = NewEdge(pOVar10,v0,v1,iVar7 + -1,(ON_Interval *)0x0,
                            (double)c3[7].super_ON_Geometry.super_ON_Object.m_userdata_list);
          Vmap[Lcount] = pOVar11->m_edge_index;
          ON_Object::CopyUserData((ON_Object *)pOVar11,(ON_Object *)c3);
          pOVar11->m_edge_user = *(ON_U *)(c3 + 4);
        }
      }
      sub_bbox.m_max.z._7_1_ = ON_BoundingBox::IsValid(&this->m_bbox);
      ON_BoundingBox::ON_BoundingBox((ON_BoundingBox *)&face_1);
      for (Lcount = 0; Lcount < subfi_count; Lcount = Lcount + 1) {
        srf = (ON_Surface *)
              ON_ClassArray<ON_BrepFace>::operator[]
                        ((ON_ClassArray<ON_BrepFace> *)&this->m_F,subfi[Lcount]);
        iVar7 = (*(((ON_BrepFace *)srf)->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.
                  super_ON_Object._vptr_ON_Object[0x24])();
        sub_face = (ON_BrepFace *)CONCAT44(extraout_var_00,iVar7);
        if (sub_face == (ON_BrepFace *)0x0) {
          this_local = (ON_Brep *)0x0;
          goto LAB_0056640d;
        }
        ON_SimpleArray<ON_Surface_*>::Append
                  (&((leak_stopper.m_sub_brep)->m_S).super_ON_SimpleArray<ON_Surface_*>,
                   (ON_Surface **)&sub_face);
        pOVar10 = leak_stopper.m_sub_brep;
        iVar7 = ON_SimpleArray<ON_Surface_*>::Count
                          (&((leak_stopper.m_sub_brep)->m_S).super_ON_SimpleArray<ON_Surface_*>);
        loop_1 = (ON_BrepLoop *)NewFace(pOVar10,iVar7 + -1);
        ON_Object::CopyUserData((ON_Object *)loop_1,(ON_Object *)srf);
        *(byte *)((long)&(loop_1->m_pbox).m_min.y + 4) =
             *(byte *)((long)&srf[4].super_ON_Geometry.super_ON_Object.m_userdata_list + 4) & 1;
        *(undefined4 *)&(loop_1->m_pbox).m_min.z =
             *(undefined4 *)&srf[5].super_ON_Geometry.super_ON_Object._vptr_ON_Object;
        *(undefined8 *)((long)&(loop_1->m_pbox).m_min.z + 4) =
             *(undefined8 *)((long)&srf[5].super_ON_Geometry.super_ON_Object._vptr_ON_Object + 4);
        *(undefined8 *)((long)&(loop_1->m_pbox).m_max.x + 4) =
             *(undefined8 *)((long)&srf[5].super_ON_Geometry.super_ON_Object.m_userdata_list + 4);
        memcpy(&(loop_1->m_pbox).m_max.z,&srf[6].super_ON_Geometry.super_ON_Object.m_userdata_list,
               0x30);
        loop_1[1].m_ti._vptr_ON_SimpleArray =
             (_func_int **)srf[9].super_ON_Geometry.super_ON_Object.m_userdata_list;
        loop_1[1].m_ti.m_a = (int *)srf[10].super_ON_Geometry.super_ON_Object._vptr_ON_Object;
        *(ON_UserData **)&loop_1[1].m_ti.m_count =
             srf[10].super_ON_Geometry.super_ON_Object.m_userdata_list;
        *(_func_int ***)&loop_1[1].m_type =
             srf[0xb].super_ON_Geometry.super_ON_Object._vptr_ON_Object;
        (loop_1->m_ti)._vptr_ON_SimpleArray =
             srf[2].super_ON_Geometry.super_ON_Object._vptr_ON_Object;
        if ((sub_bbox.m_max.z._7_1_ & 1) != 0) {
          bVar6 = ON_BoundingBox::IsValid((ON_BoundingBox *)&(loop_1->m_pbox).m_max.z);
          if (bVar6) {
            ON_BoundingBox::Union
                      ((ON_BoundingBox *)&face_1,(ON_BoundingBox *)&(loop_1->m_pbox).m_max.z);
          }
          else {
            sub_bbox.m_max.z._7_1_ = 0;
            ON_BoundingBox::Destroy((ON_BoundingBox *)&face_1);
          }
        }
        for (i = 0; iVar7 = i, iVar8 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)(srf + 3)),
            iVar7 < iVar8; i = i + 1) {
          piVar9 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)(srf + 3),i);
          sub_loop = ON_ClassArray<ON_BrepLoop>::operator[]
                               ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,*piVar9);
          trim_1 = (ON_BrepTrim *)
                   NewLoop(leak_stopper.m_sub_brep,sub_loop->m_type,(ON_BrepFace *)loop_1);
          ON_Object::CopyUserData((ON_Object *)trim_1,(ON_Object *)sub_loop);
          memcpy(&trim_1->m_trim_user,&sub_loop->m_pbox,0x30);
          (trim_1->super_ON_CurveProxy).m_real_curve = (ON_Curve *)sub_loop->m_loop_user;
          for (j = 0; iVar7 = j, iVar8 = ON_SimpleArray<int>::Count(&sub_loop->m_ti), iVar7 < iVar8;
              j = j + 1) {
            piVar9 = ON_SimpleArray<int>::operator[](&sub_loop->m_ti,j);
            c2 = (ON_Curve *)
                 ON_ClassArray<ON_BrepTrim>::operator[]
                           ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,*piVar9);
            if ((*(int *)((face->m_face_uuid).Data4 + (long)((ON_BrepTrim *)c2)->m_vi[0] * 4 + -0x5c
                         ) < 0) ||
               (*(int *)((face->m_face_uuid).Data4 + (long)((ON_BrepTrim *)c2)->m_vi[1] * 4 + -0x5c)
                < 0)) {
              this_local = (ON_Brep *)0x0;
              goto LAB_0056640d;
            }
            if ((-1 < ((ON_BrepTrim *)c2)->m_ei) && (Vmap[((ON_BrepTrim *)c2)->m_ei] < 0)) {
              this_local = (ON_Brep *)0x0;
              goto LAB_0056640d;
            }
            if (((ON_BrepTrim *)c2)->m_c2i < 0) {
              if (((ON_BrepTrim *)c2)->m_type != ptonsrf) {
                this_local = (ON_Brep *)0x0;
                goto LAB_0056640d;
              }
            }
            else {
              iVar7 = (*(((ON_BrepTrim *)c2)->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.
                        super_ON_Object._vptr_ON_Object[0x24])();
              sub_edge_1 = (ON_BrepEdge *)CONCAT44(extraout_var_01,iVar7);
              if (sub_edge_1 == (ON_BrepEdge *)0x0) {
                this_local = (ON_Brep *)0x0;
                goto LAB_0056640d;
              }
              ON_SimpleArray<ON_Curve_*>::Append
                        (&((leak_stopper.m_sub_brep)->m_C2).super_ON_SimpleArray<ON_Curve_*>,
                         (ON_Curve **)&sub_edge_1);
            }
            if (*(int *)((long)&c2[5].super_ON_Geometry.super_ON_Object._vptr_ON_Object + 4) < 0) {
              if (*(int *)((long)&c2[6].super_ON_Geometry.super_ON_Object._vptr_ON_Object + 4) == 4)
              {
                vertex_00 = (ON_BrepTrim *)
                            ON_ClassArray<ON_BrepVertex>::operator[]
                                      ((ON_ClassArray<ON_BrepVertex> *)
                                       &(leak_stopper.m_sub_brep)->m_V,
                                       *(int *)((face->m_face_uuid).Data4 +
                                               (long)*(int *)&c2[5].super_ON_Geometry.
                                                              super_ON_Object.m_userdata_list * 4 +
                                               -0x5c));
                pOVar10 = leak_stopper.m_sub_brep;
                pOVar5 = trim_1;
                iso = *(ISO *)&c2[6].super_ON_Geometry.super_ON_Object.m_userdata_list;
                sub_trim_1 = vertex_00;
                iVar7 = ON_SimpleArray<ON_Curve_*>::Count
                                  (&((leak_stopper.m_sub_brep)->m_C2).
                                    super_ON_SimpleArray<ON_Curve_*>);
                NewSingularTrim(pOVar10,(ON_BrepVertex *)vertex_00,(ON_BrepLoop *)pOVar5,iso,
                                iVar7 + -1);
              }
              else {
                if (*(int *)((long)&c2[6].super_ON_Geometry.super_ON_Object._vptr_ON_Object + 4) !=
                    6) {
                  this_local = (ON_Brep *)0x0;
                  goto LAB_0056640d;
                }
                sub_vertex_2 = (ON_BrepVertex *)
                               NewTrim(leak_stopper.m_sub_brep,false,(ON_BrepLoop *)trim_1,-1);
                ((ON_BrepTrim *)sub_vertex_2)->m_type = ptonsrf;
                sub_trim = (ON_BrepTrim *)
                           ON_ClassArray<ON_BrepVertex>::operator[]
                                     ((ON_ClassArray<ON_BrepVertex> *)
                                      &(leak_stopper.m_sub_brep)->m_V,
                                      *(int *)((face->m_face_uuid).Data4 +
                                              (long)*(int *)&c2[5].super_ON_Geometry.super_ON_Object
                                                             .m_userdata_list * 4 + -0x5c));
                uVar4 = *(undefined4 *)((long)(sub_trim->super_ON_CurveProxy).m_this_domain.m_t + 4)
                ;
                *(undefined4 *)
                 ((long)&sub_vertex_2[1].super_ON_Point.super_ON_Geometry.super_ON_Object.
                         _vptr_ON_Object + 4) = uVar4;
                *(undefined4 *)
                 &sub_vertex_2[1].super_ON_Point.super_ON_Geometry.super_ON_Object._vptr_ON_Object =
                     uVar4;
              }
            }
            else {
              pOVar11 = ON_ClassArray<ON_BrepEdge>::operator[]
                                  ((ON_ClassArray<ON_BrepEdge> *)&(leak_stopper.m_sub_brep)->m_E,
                                   Vmap[*(int *)((long)&c2[5].super_ON_Geometry.super_ON_Object.
                                                        _vptr_ON_Object + 4)]);
              pOVar10 = leak_stopper.m_sub_brep;
              pOVar5 = trim_1;
              bVar3 = *(byte *)&c2[6].super_ON_Geometry.super_ON_Object._vptr_ON_Object;
              sub_vertex_1 = (ON_BrepVertex *)pOVar11;
              iVar7 = ON_SimpleArray<ON_Curve_*>::Count
                                (&((leak_stopper.m_sub_brep)->m_C2).super_ON_SimpleArray<ON_Curve_*>
                                );
              NewTrim(pOVar10,pOVar11,(bool)(bVar3 & 1),(ON_BrepLoop *)pOVar5,iVar7 + -1);
            }
            this_00 = &(leak_stopper.m_sub_brep)->m_T;
            iVar7 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)this_00);
            local_1a8 = ON_ClassArray<ON_BrepTrim>::operator[]
                                  ((ON_ClassArray<ON_BrepTrim> *)this_00,iVar7 + -1);
            ON_Object::CopyUserData((ON_Object *)local_1a8,(ON_Object *)c2);
            local_1a8->m__legacy_2d_tol =
                 (double)c2[0xc].super_ON_Geometry.super_ON_Object.m_userdata_list;
            local_1a8->m__legacy_3d_tol =
                 (double)c2[0xd].super_ON_Geometry.super_ON_Object._vptr_ON_Object;
            local_1a8->m__legacy_flags =
                 *(int *)&c2[0xd].super_ON_Geometry.super_ON_Object.m_userdata_list;
            local_1a8->m_tolerance[0] =
                 (double)c2[7].super_ON_Geometry.super_ON_Object._vptr_ON_Object;
            local_1a8->m_tolerance[1] =
                 (double)c2[7].super_ON_Geometry.super_ON_Object.m_userdata_list;
            memcpy(&local_1a8->m_pbox,&c2[9].super_ON_Geometry.super_ON_Object.m_userdata_list,0x30)
            ;
            local_1a8->m_iso = *(ISO *)&c2[6].super_ON_Geometry.super_ON_Object.m_userdata_list;
            local_1a8->m_trim_user = *(ON_U *)(c2 + 4);
            if (*(int *)((long)&c2[6].super_ON_Geometry.super_ON_Object._vptr_ON_Object + 4) != 2) {
              local_1a8->m_type =
                   *(TYPE *)((long)&c2[6].super_ON_Geometry.super_ON_Object._vptr_ON_Object + 4);
            }
          }
        }
      }
      if (((sub_bbox.m_max.z._7_1_ & 1) == 0) ||
         (bVar6 = ON_BoundingBox::IsValid((ON_BoundingBox *)&face_1), !bVar6)) {
        ON_Geometry::BoundingBox(&local_1d8,&(leak_stopper.m_sub_brep)->super_ON_Geometry);
      }
      else {
        memcpy(&(leak_stopper.m_sub_brep)->m_bbox,&face_1,0x30);
      }
      leak_stopper.super_ON_Workspace.m_pMemBlk = (ON_Workspace_MBLK *)0x0;
      leak_stopper.m_p = (ON_Brep *)0x0;
      this_local = leak_stopper.m_sub_brep;
    }
  }
LAB_0056640d:
  fli = 1;
  SubBrep::LeakStopper::~LeakStopper((LeakStopper *)local_50);
  return this_local;
}

Assistant:

ON_Brep* ON_Brep::SubBrep( 
          int subfi_count, 
          const int* subfi, 
          ON_Brep* sub_brep
          ) const
{
  class LeakStopper : public ON_Workspace
  {
    // If an error occures during construction,
    // this class cleans up sub_brep in an
    // appropriate fashion.
  public:
    LeakStopper() {m_p=0;m_sub_brep=0;}
    ~LeakStopper() {if (m_p) delete m_p; else if (m_sub_brep) m_sub_brep->Destroy();}
    ON_Brep* m_p;        // ON_Brep::SubBrep allocated sub_brep
    ON_Brep* m_sub_brep; // user's sub_brep argument
  };
  LeakStopper leak_stopper;

  if ( sub_brep )
    sub_brep->Destroy();

  if ( subfi_count <= 0 || 0 == subfi )
    return 0;

  if ( subfi_count > m_F.Count() )
    return 0;

  // validate indices in extract_fi[] and
  // make sure there are no duplicates.
  int fi, fli, lti, i, j;
  int Lcount = 0;
  int Tcount = 0;
  int Ecount = 0;
  int Vcount = 0;
  int maxfi = -1;
  int minfi = m_F.Count();
  int* Emap = leak_stopper.GetIntMemory(m_E.Count());
  memset(Emap,0,m_E.Count()*sizeof(Emap[0]));
  int* Vmap = leak_stopper.GetIntMemory(m_V.Count());
  memset(Vmap,0,m_V.Count()*sizeof(Vmap[0]));
  for ( i = 0; i < subfi_count; i++ )
  {
    fi = subfi[i];
    if ( fi < 0 || fi >= m_F.Count() )
    {
      ON_ERROR("ON_Brep::SubBrep sub_fi[] has invalid indices");
      return 0;
    }
    if ( fi > maxfi )
      maxfi = fi;
    else if ( fi < minfi )
      minfi = fi;
    else
    {
      for ( j = 0; j < i; j++ )
      {
        if ( subfi[j] == fi )
        {
          ON_ERROR("ON_Brep::SubBrep sub_fi[] has duplicate indices");
          return 0;
        }
      }
    }

    const ON_BrepFace& face = m_F[fi];
    for ( fli = 0; fli < face.m_li.Count(); fli++ )
    {
      const ON_BrepLoop* loop = face.Loop(fli);
      if ( !loop || this != loop->Brep() )
        return 0;
      Lcount++;
      for ( lti = 0; lti < loop->m_ti.Count(); lti++ )
      {
        const ON_BrepTrim* trim = loop->Trim(lti);
        if ( !trim || this != trim->Brep() )
          return 0;
        Tcount++;
        if ( trim->m_vi[0] < 0 || trim->m_vi[0] >= m_V.Count() )
          return 0;
        if ( trim->m_vi[1] < 0 || trim->m_vi[1] >= m_V.Count() )
          return 0;
        if ( 0 == Vmap[trim->m_vi[0]] )
        {
          Vmap[trim->m_vi[0]] = 1;
          Vcount++;
        }
        if ( 0 == Vmap[trim->m_vi[1]] )
        {
          Vmap[trim->m_vi[1]] = 1;
          Vcount++;
        }
        if ( ON_BrepTrim::singular == trim->m_type ||
             ON_BrepTrim::ptonsrf == trim->m_type)   // March 29, 2010 Lowell - Allow ptonsrf
        {
          if ( trim->m_ei >= 0 || trim->m_vi[0] != trim->m_vi[1] )
            return 0;
        }
        else if ( trim->m_ei >= 0 )
        {
          const ON_BrepEdge* edge = trim->Edge();
          if ( 0 == edge || this != edge->Brep() )
            return 0;
          if ( 0 == Emap[trim->m_ei] )
          {
            Emap[trim->m_ei] = 1;
            Ecount++;
            // edge's vertices should already be mapped.
            if ( 0 == Vmap[edge->m_vi[0]] )
              return 0;
            if ( 0 == Vmap[edge->m_vi[1]] )
              return 0;
          }          
        }
        else
        {
          return 0;
        }
      }
    }
  }

  if ( !sub_brep )
  {
    sub_brep = ON_Brep::New();
    leak_stopper.m_p = sub_brep;
  }
  else
  {
    leak_stopper.m_sub_brep = sub_brep;
  }

  sub_brep->m_F.Reserve(subfi_count);
  sub_brep->m_L.Reserve(Lcount);
  sub_brep->m_T.Reserve(Tcount);
  sub_brep->m_E.Reserve(Ecount);
  sub_brep->m_V.Reserve(Vcount);
  sub_brep->m_S.Reserve(subfi_count);
  sub_brep->m_C2.Reserve(Tcount);
  sub_brep->m_C3.Reserve(Ecount);

  // build sub_brep vertices
  for ( i = 0; i < m_V.Count(); i++ )
  {
    if ( Vmap[i] )
    {
      const ON_BrepVertex& vertex = m_V[i];
      ON_BrepVertex& sub_vertex = sub_brep->NewVertex(vertex.point,vertex.m_tolerance);
      Vmap[i] = sub_vertex.m_vertex_index;
      sub_vertex.CopyUserData(vertex);
      // March 29, 2010 Lowell - Copy user fields
      memcpy(&sub_vertex.m_vertex_user, &vertex.m_vertex_user, sizeof(sub_vertex.m_vertex_user));
    }
    else
      Vmap[i] = -1;
  }

  // build sub_brep edges
  for ( i = 0; i < m_E.Count(); i++ )
  {
    if ( Emap[i] )
    {
      const ON_BrepEdge& edge = m_E[i];
      if ( Vmap[edge.m_vi[0]] < 0 )
        return 0;
      if ( Vmap[edge.m_vi[1]] < 0 )
        return 0;
      ON_Curve* c3 = edge.DuplicateCurve();
      if ( 0 == c3 )
        return 0;
      sub_brep->m_C3.Append(c3);
      ON_BrepVertex& sub_v0 = sub_brep->m_V[Vmap[edge.m_vi[0]]];
      ON_BrepVertex& sub_v1 = sub_brep->m_V[Vmap[edge.m_vi[1]]];
      ON_BrepEdge& sub_edge = sub_brep->NewEdge(sub_v0,sub_v1,sub_brep->m_C3.Count()-1,0,edge.m_tolerance);
      Emap[i] = sub_edge.m_edge_index;
      sub_edge.CopyUserData(edge);
      // March 29, 2010 Lowell - Copy user fields
      memcpy(&sub_edge.m_edge_user, &edge.m_edge_user, sizeof(sub_edge.m_edge_user));
    }
    else
      Emap[i] = -1;
  }

  bool bHaveBBox = m_bbox.IsValid();
  ON_BoundingBox sub_bbox;

  for ( i = 0; i < subfi_count; i++ )
  {
    const ON_BrepFace& face = m_F[subfi[i]];
    ON_Surface* srf = face.DuplicateSurface();
    if (!srf)
      return 0;
    sub_brep->m_S.Append(srf);
    ON_BrepFace& sub_face = sub_brep->NewFace(sub_brep->m_S.Count()-1);
    sub_face.CopyUserData(face);
    sub_face.m_bRev = face.m_bRev;
    sub_face.m_face_material_channel = face.m_face_material_channel;
    sub_face.m_face_uuid = face.m_face_uuid;
    sub_face.m_bbox = face.m_bbox;
    sub_face.m_domain[0] = face.m_domain[0];
    sub_face.m_domain[1] = face.m_domain[1];
    // March 29, 2010 Lowell - Copy user fields
    memcpy(&sub_face.m_face_user, &face.m_face_user, sizeof(sub_face.m_face_user));

    if ( bHaveBBox )
    {
      if ( sub_face.m_bbox.IsValid() )
        sub_bbox.Union(sub_face.m_bbox);
      else
      {
        bHaveBBox = false;
        sub_bbox.Destroy();
      }
    }


    for ( fli = 0; fli < face.m_li.Count(); fli++ )
    {
      const ON_BrepLoop& loop = m_L[face.m_li[fli]];
      ON_BrepLoop& sub_loop = sub_brep->NewLoop(loop.m_type,sub_face);
      sub_loop.CopyUserData(loop);
      sub_loop.m_pbox = loop.m_pbox;
      // April 19, 2010 Lowell - Copy user fields
      memcpy(&sub_loop.m_loop_user, &loop.m_loop_user, sizeof(sub_loop.m_loop_user));

      for ( lti = 0; lti < loop.m_ti.Count(); lti++ )
      {
        const ON_BrepTrim& trim = m_T[loop.m_ti[lti]];
        if ( Vmap[trim.m_vi[0]] < 0 || Vmap[trim.m_vi[1]] < 0 )
          return 0;
        if ( trim.m_ei >= 0 && Emap[trim.m_ei] < 0 )
          return 0;
        if(trim.m_c2i >= 0)
        {
          ON_Curve* c2 = trim.DuplicateCurve();
          if ( !c2 )
            return 0;
          sub_brep->m_C2.Append(c2);
        }
        else if(trim.m_type != ON_BrepTrim::ptonsrf)
          return 0;
        if ( trim.m_ei >= 0 )
        {
          ON_BrepEdge& sub_edge = sub_brep->m_E[Emap[trim.m_ei]];
          sub_brep->NewTrim(sub_edge,trim.m_bRev3d,sub_loop,sub_brep->m_C2.Count()-1);
        }
        else if ( ON_BrepTrim::singular == trim.m_type )
        {
          ON_BrepVertex& sub_vertex = sub_brep->m_V[Vmap[trim.m_vi[0]]];
          sub_brep->NewSingularTrim(sub_vertex,sub_loop,trim.m_iso,sub_brep->m_C2.Count()-1);
        }
        // March 29, 2010 Lowell - copy ptonsrf type
        else if ( ON_BrepTrim::ptonsrf == trim.m_type)
        {
          ON_BrepTrim& sub_trim = sub_brep->NewTrim(false, sub_loop, -1);
          sub_trim.m_type = ON_BrepTrim::ptonsrf;
          ON_BrepVertex& sub_vertex = sub_brep->m_V[Vmap[trim.m_vi[0]]];
          sub_trim.m_vi[0] = sub_trim.m_vi[1] = sub_vertex.m_vertex_index;
        }
        else
        {
          return 0;
        }
        ON_BrepTrim& sub_trim = sub_brep->m_T[sub_brep->m_T.Count()-1];
        sub_trim.CopyUserData(trim);
        sub_trim.m__legacy_2d_tol = trim.m__legacy_2d_tol;
        sub_trim.m__legacy_3d_tol = trim.m__legacy_3d_tol;
        sub_trim.m__legacy_flags = trim.m__legacy_flags;
        sub_trim.m_tolerance[0] = trim.m_tolerance[0];
        sub_trim.m_tolerance[1] = trim.m_tolerance[1];
        sub_trim.m_pbox = trim.m_pbox;
        sub_trim.m_iso = trim.m_iso;
        // April 19, 2010 Lowell - Copy user fields
        memcpy(&sub_trim.m_trim_user, &trim.m_trim_user, sizeof(sub_trim.m_trim_user));

        // Since we are extracting a subset of the original brep,
        // some mated edges could turn into boundary edges. The
        // call to NewTrim() above will correctly handle setting
        // and updating sub_trims that came from mated trims.
        if ( ON_BrepTrim::mated != trim.m_type )
          sub_trim.m_type = trim.m_type;
      }
    }
  }

  if ( !bHaveBBox || !sub_bbox.IsValid() )
    sub_brep->BoundingBox();
  else
    sub_brep->m_bbox = sub_bbox;

  // return subbrep after disabling the leak stopper
  leak_stopper.m_p = 0;
  leak_stopper.m_sub_brep = 0;
  return sub_brep;
}